

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Boundary_matrix.h
# Opt level: O1

void __thiscall
Gudhi::persistence_matrix::
Boundary_matrix<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>
::Boundary_matrix(Boundary_matrix<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>
                  *this,uint numberOfColumns,Column_settings *colSettings)

{
  allocator_type local_2b;
  key_equal local_2a;
  hash<unsigned_int> local_29;
  
  (this->super_Matrix_dimension_option).dimensions_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->super_Matrix_dimension_option).dimensions_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->super_Matrix_dimension_option).dimensions_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->super_Matrix_dimension_option).maxDim_ = -1;
  Base_swap<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>,_Gudhi::persistence_matrix::Boundary_matrix<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>
  ::Base_swap(&this->
               super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options<false,_(Column_types)7,_true,_true,_true>_>_>_>
              ,numberOfColumns);
  (this->super_Base_pairing_option).super_type.map_._M_h._M_buckets = (__buckets_ptr)0x0;
  (this->super_Base_pairing_option).super_type.map_._M_h._M_bucket_count = 0;
  *(undefined8 *)&(this->super_Base_pairing_option).super_type.map_._M_h._M_rehash_policy = 0;
  (this->super_Base_pairing_option).super_type.map_._M_h._M_rehash_policy._M_next_resize = 0;
  (this->super_Base_pairing_option).super_type.map_._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->super_Base_pairing_option).super_type.map_._M_h._M_buckets =
       &(this->super_Base_pairing_option).super_type.map_._M_h._M_single_bucket;
  (this->super_Base_pairing_option).super_type.map_._M_h._M_bucket_count = 1;
  (this->super_Base_pairing_option).super_type.map_._M_h._M_before_begin._M_nxt =
       (_Hash_node_base *)0x0;
  (this->super_Base_pairing_option).super_type.map_._M_h._M_element_count = 0;
  (this->super_Base_pairing_option).super_type.map_._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->super_Base_pairing_option).barcode_.
  super__Vector_base<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_Base_pairing_option).barcode_.
  super__Vector_base<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_Base_pairing_option).barcode_.
  super__Vector_base<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_Base_pairing_option).super_type.map_._M_h._M_rehash_policy._M_next_resize = 0;
  (this->super_Base_pairing_option).super_type.map_._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->super_Base_pairing_option).deathToBar_._M_h._M_buckets =
       &(this->super_Base_pairing_option).deathToBar_._M_h._M_single_bucket;
  (this->super_Base_pairing_option).deathToBar_._M_h._M_bucket_count = 1;
  (this->super_Base_pairing_option).deathToBar_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0
  ;
  (this->super_Base_pairing_option).deathToBar_._M_h._M_element_count = 0;
  (this->super_Base_pairing_option).deathToBar_._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->super_Base_pairing_option).deathToBar_._M_h._M_rehash_policy._M_next_resize = 0;
  (this->super_Base_pairing_option).deathToBar_._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->super_Base_pairing_option).idToPosition_._M_h._M_buckets =
       &(this->super_Base_pairing_option).idToPosition_._M_h._M_single_bucket;
  (this->super_Base_pairing_option).idToPosition_._M_h._M_bucket_count = 1;
  (this->super_Base_pairing_option).idToPosition_._M_h._M_before_begin._M_nxt =
       (_Hash_node_base *)0x0;
  (this->super_Base_pairing_option).idToPosition_._M_h._M_element_count = 0;
  (this->super_Base_pairing_option).idToPosition_._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->super_Base_pairing_option).idToPosition_._M_h._M_rehash_policy._M_next_resize = 0;
  (this->super_Base_pairing_option).idToPosition_._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->super_Base_pairing_option).isReduced_ = false;
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::_Hashtable(&(this->matrix_)._M_h,(ulong)numberOfColumns,&local_29,&local_2a,&local_2b);
  this->nextInsertIndex_ = 0;
  this->colSettings_ = colSettings;
  return;
}

Assistant:

inline Boundary_matrix<Master_matrix>::Boundary_matrix(unsigned int numberOfColumns,
                                                       Column_settings* colSettings)
    : Dim_opt(Master_matrix::template get_null_value<Dimension>()),
      Swap_opt(numberOfColumns),
      Pair_opt(),
      RA_opt(numberOfColumns),
      matrix_(!Master_matrix::Option_list::has_map_column_container && Master_matrix::Option_list::has_row_access
                  ? 0
                  : numberOfColumns),
      nextInsertIndex_(0),
      colSettings_(colSettings)
{
  if constexpr (!Master_matrix::Option_list::has_map_column_container && Master_matrix::Option_list::has_row_access)
    matrix_.reserve(numberOfColumns);
}